

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR __thiscall NpyArray::SaveNPY(NpyArray *this,string *filename,bool bAppend)

{
  char type;
  value_type vVar1;
  undefined8 uVar2;
  char *pcVar3;
  size_type sVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  uchar *__ptr;
  undefined1 local_a0 [8];
  vector<char,_std::allocator<char>_> header;
  size_t i;
  LPCSTR ret;
  size_t sStack_68;
  bool _fortranOrder;
  size_t _wordSize;
  char _type;
  shape_t *local_50;
  shape_t *pShape;
  shape_t _shape;
  FILE *fp;
  bool bAppend_local;
  string *filename_local;
  NpyArray *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pShape);
  if (bAppend) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    _shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)fopen(pcVar3,"r+b");
    if ((FILE *)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == (FILE *)0x0) goto LAB_001624a7;
    this_local = (NpyArray *)
                 ParseHeaderNPY((FILE *)_shape.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (shape_t *)&pShape,&stack0xffffffffffffff98,
                                (char *)((long)&_wordSize + 3),(bool *)((long)&ret + 7));
    if (this_local != (NpyArray *)0x0) goto LAB_00162609;
    if (this->wordSize != sStack_68) {
      this_local = (NpyArray *)anon_var_dwarf_231;
      goto LAB_00162609;
    }
    sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->shape);
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pShape);
    if (sVar4 != sVar5) {
      this_local = (NpyArray *)anon_var_dwarf_23c;
      goto LAB_00162609;
    }
    for (header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 1;
        uVar2 = header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->shape),
        (ulong)uVar2 < sVar4;
        header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
             header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 1) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->shape,
                          header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      vVar1 = *pvVar6;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pShape,
                          header.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      if (vVar1 != *pvVar7) {
        this_local = (NpyArray *)anon_var_dwarf_253;
        goto LAB_00162609;
      }
    }
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->shape,0);
    vVar1 = *pvVar6;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pShape,0);
    *pvVar7 = vVar1 + *pvVar7;
    local_50 = (shape_t *)&pShape;
  }
  else {
LAB_001624a7:
    pcVar3 = (char *)std::__cxx11::string::c_str();
    _shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)fopen(pcVar3,"wb");
    local_50 = &this->shape;
  }
  if (_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    this_local = (NpyArray *)anon_var_dwarf_174;
  }
  else {
    type = this->type;
    if (type < '\x01') {
      type = -type;
    }
    CreateHeaderNPY((vector<char,_std::allocator<char>_> *)local_a0,local_50,type,this->wordSize);
    fseek((FILE *)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0,0);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)local_a0);
    sVar4 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_a0);
    fwrite(pcVar3,1,sVar4,
           (FILE *)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    fseek((FILE *)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0,2);
    __ptr = Data<unsigned_char>(this);
    fwrite(__ptr,this->wordSize,this->numValues,
           (FILE *)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    fclose((FILE *)_shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    this_local = (NpyArray *)0x0;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_a0);
  }
LAB_00162609:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pShape);
  return (LPCSTR)this_local;
}

Assistant:

LPCSTR NpyArray::SaveNPY(std::string filename, bool bAppend) const
{
	FILE* fp;
	shape_t _shape;
	const shape_t* pShape;
	if (bAppend && (fp=fopen(filename.c_str(), "r+b")) != NULL) {
		// file exists, append to it; read the header, modify the array size
		char _type;
		size_t _wordSize;
		bool _fortranOrder;
		LPCSTR ret = ParseHeaderNPY(fp, _shape, _wordSize, _type, _fortranOrder);
		if (ret != NULL)
			return ret;
		ASSERT(!_fortranOrder);

		if (wordSize != _wordSize)
			return "error: npy_save word size";
		if (shape.size() != _shape.size())
			return "error: npy_save attempting to append mis-dimensioned data";

		for (size_t i = 1; i < shape.size(); i++) {
			if (shape[i] != _shape[i])
				return "error: npy_save attempting to append misshaped data";
		}
		_shape[0] += shape[0];
		pShape = &_shape;
	} else {
		// create a new file
		fp = fopen(filename.c_str(), "wb");
		pShape = &shape;
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> header = CreateHeaderNPY(*pShape, std::abs(type), wordSize);

	fseek(fp, 0, SEEK_SET);
	fwrite(header.data(), sizeof(char), header.size(), fp);
	fseek(fp, 0, SEEK_END);
	fwrite(Data(), wordSize, numValues, fp);
	fclose(fp);
	return NULL;
}